

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O1

void test_convert<unsigned_char,float>(uint length,uchar value)

{
  float fVar1;
  ulong __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int i;
  void *__s;
  ulong uVar3;
  undefined8 *puVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  shared_ptr<unsigned_char> pt;
  shared_ptr<float> pu;
  
  __n = (ulong)length;
  __s = operator_new__((long)(int)length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,void(*)(unsigned_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,__s,
             nosimd::common::free<unsigned_char>);
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar3 = (long)(int)length * 4;
  }
  pt.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<float>);
  _Var2._M_pi = pt.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (0 < (int)length) {
    memset(__s,(uint)value,__n);
    uVar3 = 0;
    do {
      *(float *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar3 * 4) =
           (float)*(byte *)((long)__s + uVar3);
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  if (length != 0) {
    fVar6 = (float)value;
    uVar3 = 0;
    do {
      fVar1 = *(float *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar3 * 4);
      fVar7 = fVar1 - fVar6;
      uVar5 = -(uint)(fVar7 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar5 & (uint)fVar7 | (uint)(fVar6 - fVar1) & uVar5)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_convert(unsigned int, _T) [_T = unsigned char, _U = float]";
        *(undefined4 *)(puVar4 + 1) = 0x17;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  if (pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}